

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

void sendsuboption(Curl_easy *data,int option)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  TELNET *pTVar3;
  connectdata *pcVar4;
  ssize_t sVar5;
  uint *puVar6;
  
  if (option == 0x1f) {
    pTVar3 = (data->req).p.telnet;
    pcVar4 = data->conn;
    pTVar3->subbuffer[0] = 0xff;
    pTVar3->subbuffer[1] = 0xfa;
    pTVar3->subbuffer[2] = '\x1f';
    uVar1 = pTVar3->subopt_wsx;
    uVar2 = pTVar3->subopt_wsy;
    pTVar3->subbuffer[3] = (uchar)(uVar1 >> 8);
    pTVar3->subbuffer[4] = (uchar)uVar1;
    pTVar3->subbuffer[5] = (uchar)(uVar2 >> 8);
    pTVar3->subbuffer[6] = (uchar)uVar2;
    pTVar3->subbuffer[7] = 0xff;
    pTVar3->subbuffer[8] = 0xf0;
    pTVar3->subend = pTVar3->subbuffer + 9;
    pTVar3->subpointer = pTVar3->subbuffer;
    printsub(data,0x3e,pTVar3->subbuffer + 2,7);
    sVar5 = send(pcVar4->sock[0],pTVar3->subbuffer,3,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
    }
    send_telnet_data(data,(char *)(pTVar3->subbuffer + 3),4);
    sVar5 = send(pcVar4->sock[0],pTVar3->subbuffer + 7,2,0x4000);
    if (sVar5 < 0) {
      puVar6 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar6);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct Curl_easy *data, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char *uc1, *uc2;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  switch(option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with little or big endian processors */
    /* Window size must be sent according to the 'network order' */
    x = htons(tn->subopt_wsx);
    y = htons(tn->subopt_wsy);
    uc1 = (unsigned char *)&x;
    uc2 = (unsigned char *)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer + 2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(data, (char *)tn->subbuffer + 3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer + 7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}